

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lputil.c
# Opt level: O1

_Bool ValidateMagicF(FILE *file,uint8_t *expected_magic,size_t magic_len)

{
  void *__ptr;
  size_t sVar1;
  _Bool _Var2;
  
  __ptr = malloc(magic_len);
  if (__ptr == (void *)0x0) {
    ValidateMagicF_cold_1();
LAB_001017da:
    fclose((FILE *)file);
    _Var2 = false;
  }
  else {
    fread(__ptr,1,magic_len,(FILE *)file);
    _Var2 = magic_len == 0;
    if (!_Var2) {
      sVar1 = 0;
      do {
        if (*(uint8_t *)((long)__ptr + sVar1) != expected_magic[sVar1]) {
          LPDebug("","(%s) %d != %d","ValidateMagicF");
          goto LAB_001017da;
        }
        sVar1 = sVar1 + 1;
      } while (magic_len != sVar1);
      _Var2 = true;
    }
  }
  free(__ptr);
  return _Var2;
}

Assistant:

bool
ValidateMagicF(FILE *file, const uint8_t *expected_magic, const size_t magic_len)
{
	bool rv = true;

	uint8_t *our_magic = malloc(magic_len);
	if (!our_magic) {
		LPWarn("", "(%s) Couldn't malloc our magic", __func__);
		fclose(file);
		rv = false;
		goto done;
	}

	fread(our_magic, 1, magic_len, file);

	for (int i = 0; i < magic_len; i++) {
		if (our_magic[i] != expected_magic[i]) {
			LPDebug("", "(%s) %d != %d", __func__, our_magic[i], expected_magic[i]);
			fclose(file);
			rv = false;
			goto done;
		}
	}

done:
	free(our_magic);
	return rv;
}